

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

sockaddr_in get_address(char *strip,char *strport)

{
  sockaddr_in sVar1;
  int iVar2;
  hostent *phVar3;
  hostent *host_info;
  char *strport_local;
  char *strip_local;
  sockaddr_in addr;
  
  bzero(&strip_local,0x10);
  strip_local._0_2_ = 2;
  iVar2 = atoi(strport);
  strip_local._2_2_ = htons((uint16_t)iVar2);
  phVar3 = gethostbyname(strip);
  memcpy((void *)((long)&strip_local + 4),*phVar3->h_addr_list,(long)phVar3->h_length);
  sVar1.sin_port = strip_local._2_2_;
  sVar1.sin_family = strip_local._0_2_;
  sVar1.sin_addr.s_addr = strip_local._4_4_;
  sVar1.sin_zero[0] = (undefined1)addr.sin_family;
  sVar1.sin_zero[1] = addr.sin_family._1_1_;
  sVar1.sin_zero[2] = (undefined1)addr.sin_port;
  sVar1.sin_zero[3] = addr.sin_port._1_1_;
  sVar1.sin_zero[4] = (undefined1)addr.sin_addr.s_addr;
  sVar1.sin_zero[5] = addr.sin_addr.s_addr._1_1_;
  sVar1.sin_zero[6] = addr.sin_addr.s_addr._2_1_;
  sVar1.sin_zero[7] = addr.sin_addr.s_addr._3_1_;
  return sVar1;
}

Assistant:

struct sockaddr_in get_address(char *strip, char *strport) {
    struct sockaddr_in addr;
    bzero(&addr, sizeof(struct sockaddr_in));
    addr.sin_family = PF_INET;
    addr.sin_port = htons((unsigned short)atoi(strport));
    struct hostent *host_info = gethostbyname(strip);
    memcpy(&(addr.sin_addr), host_info->h_addr, (size_t)host_info->h_length);
    return addr;
}